

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-writer.c
# Opt level: O1

void test_writer_install(TestSuite *suite)

{
  TestSuite_Add(suite,"/bson/writer/custom_realloc",test_bson_writer_custom_realloc);
  TestSuite_Add(suite,"/bson/writer/shared_buffer",test_bson_writer_shared_buffer);
  TestSuite_Add(suite,"/bson/writer/empty_sequence",test_bson_writer_empty_sequence);
  TestSuite_Add(suite,"/bson/writer/null_realloc",test_bson_writer_null_realloc);
  TestSuite_Add(suite,"/bson/writer/null_realloc_2",test_bson_writer_null_realloc_2);
  return;
}

Assistant:

void
test_writer_install (TestSuite *suite)
{
   TestSuite_Add (
      suite, "/bson/writer/custom_realloc", test_bson_writer_custom_realloc);
   TestSuite_Add (
      suite, "/bson/writer/shared_buffer", test_bson_writer_shared_buffer);
   TestSuite_Add (
      suite, "/bson/writer/empty_sequence", test_bson_writer_empty_sequence);
   TestSuite_Add (
      suite, "/bson/writer/null_realloc", test_bson_writer_null_realloc);
   TestSuite_Add (
      suite, "/bson/writer/null_realloc_2", test_bson_writer_null_realloc_2);
}